

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::ConfidentialTransactionController::GetSizeIgnoreTxIn
          (ConfidentialTransactionController *this,bool is_blinded,uint32_t *witness_area_size,
          uint32_t *no_witness_area_size,int exponent,int minimum_bits)

{
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000031;
  ConfidentialTxOutReference *txout;
  pointer this_00;
  int iVar3;
  pointer pCVar4;
  uint32_t input_asset_count;
  uint32_t temp_no_witness_size;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  uint32_t *local_98;
  uint32_t *local_90;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  txins;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  uint32_t temp_witness_size;
  
  local_a4 = (undefined4)CONCAT71(in_register_00000031,is_blinded);
  local_a0 = exponent;
  local_9c = minimum_bits;
  local_98 = witness_area_size;
  local_90 = no_witness_area_size;
  core::ConfidentialTransaction::GetTxOutList(&txouts,&this->transaction_);
  core::ConfidentialTransaction::GetTxInList(&txins,&this->transaction_);
  input_asset_count = 0;
  for (pCVar4 = txins.
                super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar4 != txins.
                super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar4 = pCVar4 + 1) {
    core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&temp_witness_size,&pCVar4->issuance_amount_);
    bVar1 = core::ConfidentialValue::IsEmpty((ConfidentialValue *)&temp_witness_size);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&temp_witness_size);
    if (!bVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_witness_size,
                 &(pCVar4->blinding_nonce_).data_);
      bVar1 = core::ByteData256::IsEmpty((ByteData256 *)&temp_witness_size);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_witness_size);
      input_asset_count = input_asset_count + bVar1 + 1;
    }
    input_asset_count = input_asset_count + 1;
  }
  temp_witness_size = 0;
  temp_no_witness_size = 0;
  iVar3 = 0;
  bVar1 = local_a4._0_1_;
  iVar2 = 0;
  for (this_00 = txouts.
                 super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      txouts.
      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    core::ConfidentialTxOutReference::GetSerializeSize
              (this_00,bVar1,&temp_witness_size,&temp_no_witness_size,local_a0,local_9c,
               (uint32_t *)0x0,input_asset_count);
    iVar3 = iVar3 + temp_witness_size;
    iVar2 = iVar2 + temp_no_witness_size;
  }
  if (local_98 != (uint32_t *)0x0) {
    *local_98 = *local_98 + iVar3;
  }
  if (local_90 != (uint32_t *)0x0) {
    *local_90 = *local_90 + iVar2 + 0xb;
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector(&txins);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&txouts);
  return iVar2 + 0xb + iVar3;
}

Assistant:

uint32_t ConfidentialTransactionController::GetSizeIgnoreTxIn(
    bool is_blinded, uint32_t* witness_area_size,
    uint32_t* no_witness_area_size, int exponent, int minimum_bits) const {
  uint32_t size = ConfidentialTransaction::kElementsTransactionMinimumSize;
  std::vector<ConfidentialTxOutReference> txouts = transaction_.GetTxOutList();
  std::vector<ConfidentialTxInReference> txins = transaction_.GetTxInList();

  uint32_t temp_asset_count = 0;

  // search vin from issue/reissue
  for (const auto& txin : txins) {
    if (!txin.GetIssuanceAmount().IsEmpty()) {
      ++temp_asset_count;
      if (!txin.GetBlindingNonce().IsEmpty()) {
        // reissuance
      } else {
        ++temp_asset_count;  // issuance
      }
    }
    ++temp_asset_count;
  }

  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  uint32_t temp_witness_size = 0;
  uint32_t temp_no_witness_size = 0;
  for (const auto& txout : txouts) {
    txout.GetSerializeSize(
        is_blinded, &temp_witness_size, &temp_no_witness_size, exponent,
        minimum_bits, nullptr, temp_asset_count);
    witness_size += temp_witness_size;
    no_witness_size += temp_no_witness_size;
  }
  size += no_witness_size;

  if (witness_area_size != nullptr) {
    *witness_area_size += witness_size;
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size += size;
  }
  return size + witness_size;
}